

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void anon_unknown.dwarf_10fe8b8::addFileSetEntry
               (cmGeneratorTarget *headTarget,string *config,
               cmGeneratorExpressionDAGChecker *dagChecker,cmFileSet *fileSet,
               EvaluatedTargetPropertyEntries *entries)

{
  pointer pEVar1;
  pointer pcVar2;
  cmMakefile *this;
  cmGeneratorExpressionDAGChecker *dagChecker_00;
  EvaluatedTargetPropertyEntries *pEVar3;
  size_type sVar4;
  bool bVar5;
  pointer puVar6;
  cmSourceFile *this_00;
  string *psVar7;
  cmSourceGroup *pcVar8;
  string *psVar9;
  pointer this_01;
  pointer puVar10;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *dirCge;
  pointer puVar11;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  allocator<char> local_1b1;
  cmFileSet *local_1b0;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_1a8;
  cmake *local_1a0;
  string w;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  string *local_158;
  cmGeneratorExpressionDAGChecker *local_150;
  EvaluatedTargetPropertyEntries *local_148;
  pointer local_140;
  string *local_138;
  undefined1 local_130 [32];
  string e;
  string path;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  dirCges;
  TargetPropertyEntryFileSet local_70;
  
  local_148 = entries;
  cmFileSet::CompileDirectoryEntries(&dirCges,fileSet);
  local_1b0 = fileSet;
  cmFileSet::EvaluateDirectoryEntries
            (&dirs,fileSet,&dirCges,headTarget->LocalGenerator,config,headTarget,dagChecker);
  do {
    puVar6 = dirCges.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar6 == dirCges.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) break;
    dirCges.
    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar6 + 1;
  } while (((puVar6->_M_t).
            super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
           HadContextSensitiveCondition != true);
  local_1a0 = cmLocalGenerator::GetCMakeInstance(headTarget->LocalGenerator);
  cmFileSet::CompileFileEntries(&local_b8,local_1b0);
  local_140 = local_b8.
              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  puVar10 = local_b8.
            super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar11 = local_b8.
            super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_158 = config;
  local_150 = dagChecker;
  do {
    dagChecker_00 = local_150;
    psVar9 = local_158;
    if (puVar11 == puVar10) {
LAB_00355387:
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector(&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&dirs);
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector(&dirCges);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_178,&dirs);
    local_70.EntryCge._M_t.
    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )(puVar11->_M_t).
           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
    (puVar11->_M_t).
    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (cmCompiledGeneratorExpression *)0x0;
    local_70.super_TargetPropertyEntry.LinkImplItem =
         &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
    local_70.super_TargetPropertyEntry._vptr_TargetPropertyEntry =
         (_func_int **)&PTR__TargetPropertyEntryFileSet_007a4f60;
    local_70.BaseDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_178.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_70.BaseDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_178.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_70.BaseDirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_178.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          )(_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            )0x0;
    local_70.FileSet = local_1b0;
    local_70.ContextSensitiveDirs =
         puVar6 != dirCges.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_1a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"",(allocator<char> *)&path);
    EvaluateTargetPropertyEntry
              ((EvaluatedTargetPropertyEntry *)&e,headTarget,psVar9,&w,dagChecker_00,
               &local_70.super_TargetPropertyEntry);
    pEVar3 = local_148;
    std::
    vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
    ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
              (&local_148->Entries,(EvaluatedTargetPropertyEntry *)&e);
    EvaluatedTargetPropertyEntry::~EvaluatedTargetPropertyEntry((EvaluatedTargetPropertyEntry *)&e);
    std::__cxx11::string::~string((string *)&w);
    pEVar1 = (pEVar3->Entries).
             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar9 = pEVar1[-1].Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_138 = pEVar1[-1].Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    while (psVar9 != local_138) {
      this_00 = cmMakefile::GetOrCreateSource(headTarget->Makefile,psVar9,false,Ambiguous);
      __y._M_str = "HEADERS";
      __y._M_len = 7;
      __x._M_str = (local_1b0->Type)._M_dataplus._M_p;
      __x._M_len = (local_1b0->Type)._M_string_length;
      bVar5 = std::operator==(__x,__y);
      if (bVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"HEADER_FILE_ONLY",(allocator<char> *)&w);
        cmSourceFile::SetProperty(this_00,&e,"TRUE");
        std::__cxx11::string::~string((string *)&e);
      }
      e._M_dataplus._M_p = (pointer)&e.field_2;
      e._M_string_length = 0;
      e.field_2._M_local_buf[0] = '\0';
      w._M_dataplus._M_p = (pointer)&w.field_2;
      w._M_string_length = 0;
      w.field_2._M_local_buf[0] = '\0';
      psVar7 = cmSourceFile::ResolveFullPath(this_00,&e,&w);
      std::__cxx11::string::string((string *)&path,(string *)psVar7);
      if (w._M_string_length != 0) {
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_130);
        cmake::IssueMessage(local_1a0,AUTHOR_WARNING,&w,(cmListFileBacktrace *)local_130);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_130 + 8));
      }
      sVar4 = path._M_string_length;
      if (path._M_string_length == 0) {
        if (e._M_string_length != 0) {
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_130);
          cmake::IssueMessage(local_1a0,FATAL_ERROR,&e,(cmListFileBacktrace *)local_130);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_130 + 8));
        }
      }
      else {
        this_01 = (headTarget->Makefile->SourceGroups).
                  super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pcVar2 = (headTarget->Makefile->SourceGroups).
                 super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        do {
          if (this_01 == pcVar2) {
            __y_00._M_str = "HEADERS";
            __y_00._M_len = 7;
            __x_00._M_str = (local_1b0->Type)._M_dataplus._M_p;
            __x_00._M_len = (local_1b0->Type)._M_string_length;
            bVar5 = std::operator==(__x_00,__y_00);
            if ((bVar5) ||
               (__y_01._M_str = "CXX_MODULE_HEADER_UNITS", __y_01._M_len = 0x17,
               __x_01._M_str = (local_1b0->Type)._M_dataplus._M_p,
               __x_01._M_len = (local_1b0->Type)._M_string_length,
               bVar5 = std::operator==(__x_01,__y_01), bVar5)) {
              this = headTarget->Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_130,"Header Files",&local_1b1);
              pcVar8 = cmMakefile::GetOrCreateSourceGroup(this,(string *)local_130);
              cmSourceGroup::AddGroupFile(pcVar8,&path);
              std::__cxx11::string::~string((string *)local_130);
            }
            break;
          }
          pcVar8 = cmSourceGroup::MatchChildrenFiles(this_01,&path);
          this_01 = this_01 + 1;
        } while (pcVar8 == (cmSourceGroup *)0x0);
      }
      std::__cxx11::string::~string((string *)&path);
      std::__cxx11::string::~string((string *)&w);
      std::__cxx11::string::~string((string *)&e);
      psVar9 = psVar9 + 1;
      puVar10 = local_140;
      if (sVar4 == 0) {
        TargetPropertyEntryFileSet::~TargetPropertyEntryFileSet(&local_70);
        goto LAB_00355387;
      }
    }
    TargetPropertyEntryFileSet::~TargetPropertyEntryFileSet(&local_70);
    puVar11 = puVar11 + 1;
  } while( true );
}

Assistant:

void addFileSetEntry(cmGeneratorTarget const* headTarget,
                     std::string const& config,
                     cmGeneratorExpressionDAGChecker* dagChecker,
                     cmFileSet const* fileSet,
                     EvaluatedTargetPropertyEntries& entries)
{
  auto dirCges = fileSet->CompileDirectoryEntries();
  auto dirs = fileSet->EvaluateDirectoryEntries(
    dirCges, headTarget->GetLocalGenerator(), config, headTarget, dagChecker);
  bool contextSensitiveDirs = false;
  for (auto const& dirCge : dirCges) {
    if (dirCge->GetHadContextSensitiveCondition()) {
      contextSensitiveDirs = true;
      break;
    }
  }
  cmake* cm = headTarget->GetLocalGenerator()->GetCMakeInstance();
  for (auto& entryCge : fileSet->CompileFileEntries()) {
    TargetPropertyEntryFileSet tpe(dirs, contextSensitiveDirs,
                                   std::move(entryCge), fileSet);
    entries.Entries.emplace_back(
      EvaluateTargetPropertyEntry(headTarget, config, "", dagChecker, tpe));
    for (auto const& file : entries.Entries.back().Values) {
      auto* sf = headTarget->Makefile->GetOrCreateSource(file);
      if (fileSet->GetType() == "HEADERS"_s) {
        sf->SetProperty("HEADER_FILE_ONLY", "TRUE");
      }

#ifndef CMAKE_BOOTSTRAP
      std::string e;
      std::string w;
      auto path = sf->ResolveFullPath(&e, &w);
      if (!w.empty()) {
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w,
                         headTarget->GetBacktrace());
      }
      if (path.empty()) {
        if (!e.empty()) {
          cm->IssueMessage(MessageType::FATAL_ERROR, e,
                           headTarget->GetBacktrace());
        }
        return;
      }
      bool found = false;
      for (auto const& sg : headTarget->Makefile->GetSourceGroups()) {
        if (sg.MatchChildrenFiles(path)) {
          found = true;
          break;
        }
      }
      if (!found) {
        if (fileSet->GetType() == "HEADERS"_s ||
            fileSet->GetType() == "CXX_MODULE_HEADER_UNITS"_s) {
          headTarget->Makefile->GetOrCreateSourceGroup("Header Files")
            ->AddGroupFile(path);
        }
      }
#endif
    }
  }
}